

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# losertree.h
# Opt level: O2

int __thiscall loser_tree<int>::min(loser_tree<int> *this)

{
  size_t *psVar1;
  int iVar2;
  int *piVar3;
  Stream *pSVar4;
  
  if (this->_nonempty_streams == 0) {
    __assert_fail("_nonempty_streams",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/../src/losertree.h"
                  ,0x9d,"T loser_tree<int>::min() [T = int]");
  }
  pSVar4 = node2stream(this,0);
  if (pSVar4->n != 0) {
    pSVar4 = node2stream(this,0);
    piVar3 = pSVar4->stream;
    pSVar4->stream = piVar3 + 1;
    iVar2 = *piVar3;
    pSVar4 = node2stream(this,0);
    psVar1 = &pSVar4->n;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      this->_nonempty_streams = this->_nonempty_streams - 1;
    }
    update(this);
    return iVar2;
  }
  __assert_fail("not stream_empty(node2stream(0))",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/../src/losertree.h"
                ,0x9e,"T loser_tree<int>::min() [T = int]");
}

Assistant:

T min()
	{
		//debug() << __PRETTY_FUNCTION__ << std::endl;
		assert(_nonempty_streams);
		assert(not stream_empty(node2stream(0)));
		T ret = *(node2stream(0).stream++);
		if (--node2stream(0).n == size_t(0)) { --_nonempty_streams; }
		update();
		//debug() << "\t -> " << ret << std::endl;
		return ret;
	}